

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall ImgfsFile::SectionEntry::listsection(SectionEntry *this,ImgfsFile *imgfs)

{
  uint uVar1;
  uint uVar2;
  _Alloc_hider _Var3;
  uint32_t uVar4;
  string local_78;
  size_t local_58;
  string local_50;
  
  if (g_verbose < 2) {
    uVar4 = DirEntry::offset(&this->super_DirEntry);
    uVar1 = (this->super_DirEntry)._size;
    uVar2 = this->_nextsection;
    stringformat_abi_cxx11_
              (&local_78,"i->%08x:%08x",(ulong)(this->super_DirEntry)._indexptr,
               (ulong)(this->super_DirEntry)._indexsize);
    _Var3._M_p = local_78._M_dataplus._M_p;
    nameinfo::name_abi_cxx11_(&local_50,&this->_name,imgfs);
    printf("         %08x: n->%08x %9d                        %s %s\n",(ulong)uVar4,(ulong)uVar2,
           (ulong)uVar1,_Var3._M_p,local_50._M_dataplus._M_p);
  }
  else {
    local_58 = DirEntry::calc_compressed_size(&this->super_DirEntry,imgfs);
    uVar4 = DirEntry::offset(&this->super_DirEntry);
    uVar1 = (this->super_DirEntry)._size;
    uVar2 = this->_nextsection;
    stringformat_abi_cxx11_
              (&local_78,"i->%08x:%08x",(ulong)(this->super_DirEntry)._indexptr,
               (ulong)(this->super_DirEntry)._indexsize);
    _Var3._M_p = local_78._M_dataplus._M_p;
    nameinfo::name_abi_cxx11_(&local_50,&this->_name,imgfs);
    printf("         %08x: n->%08x %9d %9d                       %s %s\n",(ulong)uVar4,(ulong)uVar2,
           (ulong)uVar1,local_58,_Var3._M_p,local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void listsection(ImgfsFile& imgfs)
        {
            if (g_verbose>1) {
                size_t compsize= calc_compressed_size(imgfs);
                printf("         %08x: n->%08x %9d %9d                       %s %s\n",
                        offset(), _nextsection, _size, int(compsize), entstring().c_str(), _name.name(imgfs).c_str());
            }
            else {
                printf("         %08x: n->%08x %9d                        %s %s\n",
                        offset(), _nextsection, _size, entstring().c_str(), _name.name(imgfs).c_str());
            }
        }